

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.h
# Opt level: O1

void __thiscall cnn::Dict::SetUnk(Dict *this,string *word)

{
  int iVar1;
  runtime_error *this_00;
  
  if (this->frozen == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Please call SetUnk() only after dictionary is frozen");
  }
  else {
    if (this->map_unk != true) {
      this->frozen = false;
      iVar1 = Convert(this,word);
      this->unk_id = iVar1;
      this->frozen = true;
      this->map_unk = true;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Set UNK more than one time");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetUnk(const std::string& word) {
    if (!frozen)
      throw std::runtime_error("Please call SetUnk() only after dictionary is frozen");
    if (map_unk)
      throw std::runtime_error("Set UNK more than one time");
  
    // temporarily unfrozen the dictionary to allow the add of the UNK
    frozen = false;
    unk_id = Convert(word);
    frozen = true;
  
    map_unk = true;
  }